

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

void Jf_ManProfileClasses(Jf_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj;
  int *piVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  int Costs [595];
  int Counts [595];
  
  memset(Counts,0,0x94c);
  memset(Costs,0,0x94c);
  printf("DSD classes that appear in more than %.1f %% of mapped nodes:\n",
         (double)p->pPars->nVerbLimit * 0.1);
  iVar6 = 0;
  iVar10 = 0;
  for (lVar9 = 0; lVar9 < p->pGia->nObjs; lVar9 = lVar9 + 1) {
    pObj = Gia_ManObj(p->pGia,(int)lVar9);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar2 = Gia_ObjIsBuf(pObj);
      if ((iVar2 == 0) && (p->pGia->pRefs[lVar9] != 0)) {
        piVar4 = Jf_ObjCuts(p,(int)lVar9);
        uVar3 = Jf_CutFuncClass(piVar4 + 1);
        if (0x252 < uVar3) {
          __assert_fail("iFunc < 595",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                        ,0x13d,"void Jf_ManProfileClasses(Jf_Man_t *)");
        }
        if (p->pPars->fGenCnf != 0) {
          iVar2 = Jf_CutCnfSizeF(p,uVar3);
          Costs[uVar3] = Costs[uVar3] + iVar2;
          iVar2 = Jf_CutCnfSizeF(p,uVar3);
          iVar10 = iVar10 + iVar2;
        }
        Counts[uVar3] = Counts[uVar3] + 1;
        iVar6 = iVar6 + 1;
      }
    }
  }
  if (iVar10 < 2) {
    iVar10 = 1;
  }
  iVar2 = 1;
  if (1 < iVar6) {
    iVar2 = iVar6;
  }
  uVar7 = 0;
  uVar8 = 0;
  uVar3 = 0;
  do {
    if (uVar7 == 0x253) {
      printf("Other  :  ");
      printf("%-20s   ","");
      printf("%8d  ",(ulong)uVar8);
      printf("%5.1f %%   ",((double)(int)uVar8 * 100.0) / (double)iVar2);
      printf("%8d  ",(ulong)uVar3);
      printf("%5.1f %%",((double)(int)uVar3 * 100.0) / (double)iVar10);
      putchar(10);
      return;
    }
    uVar1 = Counts[uVar7];
    if (uVar1 == 0) {
LAB_005b460b:
      uVar8 = uVar8 + uVar1;
      uVar3 = uVar3 + Costs[uVar7];
    }
    else {
      dVar11 = ((double)(int)uVar1 * 100.0) / (double)iVar2;
      if (dVar11 < (double)p->pPars->nVerbLimit * 0.1) goto LAB_005b460b;
      printf("%5d  :  ",uVar7 & 0xffffffff);
      pcVar5 = Sdm_ManReadDsdStr(p->pDsd,(int)uVar7);
      printf("%-20s   ",pcVar5);
      printf("%8d  ",(ulong)uVar1);
      printf("%5.1f %%   ",dVar11);
      uVar1 = Costs[uVar7];
      printf("%8d  ",(ulong)uVar1);
      printf("%5.1f %%",((double)(int)uVar1 * 100.0) / (double)iVar10);
      putchar(10);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void Jf_ManProfileClasses( Jf_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int Counts[595] = {0}, Costs[595] = {0};
    int i, iFunc, Total = 0, CostTotal = 0, Other = 0, CostOther = 0;
    printf( "DSD classes that appear in more than %.1f %% of mapped nodes:\n", 0.1 * p->pPars->nVerbLimit );
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( !Gia_ObjIsBuf(pObj) && Gia_ObjRefNumId(p->pGia, i) )
        {
            iFunc = Jf_CutFuncClass( Jf_ObjCutBest(p, i) );
            assert( iFunc < 595 );
            if ( p->pPars->fGenCnf )
            {
                Costs[iFunc] += Jf_CutCnfSizeF(p, iFunc);
                CostTotal += Jf_CutCnfSizeF(p, iFunc);
            }
            Counts[iFunc]++;
            Total++;
        }
    CostTotal = Abc_MaxInt(CostTotal, 1);
    Total = Abc_MaxInt(Total, 1);
    for ( i = 0; i < 595; i++ )
        if ( Counts[i] && 100.0 * Counts[i] / Total >= 0.1 * p->pPars->nVerbLimit )
        {
            printf( "%5d  :  ", i );
            printf( "%-20s   ", Sdm_ManReadDsdStr(p->pDsd, i) );
            printf( "%8d  ",    Counts[i] );
            printf( "%5.1f %%   ", 100.0 * Counts[i] / Total );
            printf( "%8d  ",    Costs[i] );
            printf( "%5.1f %%", 100.0 * Costs[i] / CostTotal );
            printf( "\n" );
        }
        else
        {
            Other += Counts[i];
            CostOther += Costs[i];
        }
    printf( "Other  :  " );
    printf( "%-20s   ",   "" );
    printf( "%8d  ",    Other );
    printf( "%5.1f %%   ", 100.0 * Other / Total );
    printf( "%8d  ",    CostOther );
    printf( "%5.1f %%", 100.0 * CostOther / CostTotal );
    printf( "\n" );
}